

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  ImGuiInputEvent local_18;
  
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x55c,"void ImGuiIO::AddMouseButtonEvent(int, bool)");
  }
  if ((uint)mouse_button < 5) {
    if (this->AppAcceptingEvents == true) {
      local_18.AddedByTestEngine = false;
      local_18._21_3_ = 0;
      local_18.Type = ImGuiInputEventType_MouseButton;
      local_18.Source = ImGuiInputSource_Mouse;
      local_18.field_2._5_7_ = 0;
      local_18.field_2.MouseButton.Down = down;
      local_18.field_2.MouseButton.Button = mouse_button;
      ImVector<ImGuiInputEvent>::push_back(&GImGui->InputEventsQueue,&local_18);
    }
    return;
  }
  __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x55d,"void ImGuiIO::AddMouseButtonEvent(int, bool)");
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
    if (!AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}